

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

Def * cmDefinitions::GetInternal(string *key,StackIter begin,StackIter end,bool raise)

{
  StackIter end_00;
  StackIter begin_00;
  iterator other;
  bool bVar1;
  PointerType pcVar2;
  unordered_map<cm::String,cmDefinitions::Def,std::hash<cm::String>,std::equal_to<cm::String>,std::allocator<std::pair<cm::String_const,cmDefinitions::Def>>>
  *this;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> _Var4;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> _Var5;
  undefined1 auVar6 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>,_bool>
  pVar7;
  string_view v;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> local_f8;
  undefined1 local_f0;
  __node_type *local_e8;
  cmLinkedTree<cmDefinitions> *local_e0;
  cmLinkedTree<cmDefinitions> *local_d8;
  cmLinkedTree<cmDefinitions> *local_d0;
  Def *local_c8;
  Def *def;
  cmLinkedTree<cmDefinitions> *local_b8;
  undefined1 local_b0 [8];
  StackIter it;
  String local_78;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> local_58;
  iterator it_1;
  bool raise_local;
  string *key_local;
  StackIter end_local;
  StackIter begin_local;
  
  end_local.Tree = (cmLinkedTree<cmDefinitions> *)end.Position;
  _Var4._M_cur = (__node_type *)end.Tree;
  end_local.Position = (PositionType)begin.Tree;
  _Var5._M_cur = _Var4._M_cur;
  it_1.super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>)
       (_Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>)_Var4._M_cur;
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=((iterator *)&end_local.Position,end);
  if (bVar1) {
    pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)&end_local.Position);
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
    v._M_len = auVar6._8_8_;
    v._M_str = (char *)_Var5._M_cur;
    ::cm::String::borrow(&local_78,auVar6._0_8_,v);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
         ::find(&pcVar2->Map,&local_78);
    ::cm::String::~String(&local_78);
    pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)&end_local.Position);
    it.Position = (PositionType)
                  std::
                  unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
                  ::end(&pcVar2->Map);
    bVar1 = std::__detail::operator!=
                      (&local_58,
                       (_Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>
                        *)&it.Position);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>
                           *)&local_58);
      begin_local.Position = (PositionType)&ppVar3->second;
    }
    else {
      local_b0 = (undefined1  [8])end_local.Position;
      it.Tree = (cmLinkedTree<cmDefinitions> *)begin.Position;
      cmLinkedTree<cmDefinitions>::iterator::operator++((iterator *)local_b0);
      local_b8 = end_local.Tree;
      other.Position = (PositionType)end_local.Tree;
      other.Tree = (cmLinkedTree<cmDefinitions> *)_Var4._M_cur;
      def = (Def *)_Var4._M_cur;
      bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator==((iterator *)local_b0,other);
      if (bVar1) {
        begin_local.Position = (PositionType)&NoDef;
      }
      else {
        local_d8 = (cmLinkedTree<cmDefinitions> *)local_b0;
        local_d0 = it.Tree;
        local_e0 = end_local.Tree;
        begin_00.Position = (PositionType)it.Tree;
        begin_00.Tree = (cmLinkedTree<cmDefinitions> *)local_b0;
        end_00.Position = (PositionType)end_local.Tree;
        end_00.Tree = (cmLinkedTree<cmDefinitions> *)_Var4._M_cur;
        local_e8 = _Var4._M_cur;
        local_c8 = GetInternal(key,begin_00,end_00,raise);
        begin_local.Position = (PositionType)local_c8;
        if (raise) {
          this = (unordered_map<cm::String,cmDefinitions::Def,std::hash<cm::String>,std::equal_to<cm::String>,std::allocator<std::pair<cm::String_const,cmDefinitions::Def>>>
                  *)cmLinkedTree<cmDefinitions>::iterator::operator->
                              ((iterator *)&end_local.Position);
          pVar7 = std::
                  unordered_map<cm::String,cmDefinitions::Def,std::hash<cm::String>,std::equal_to<cm::String>,std::allocator<std::pair<cm::String_const,cmDefinitions::Def>>>
                  ::emplace<std::__cxx11::string_const&,cmDefinitions::Def_const&>
                            (this,key,local_c8);
          local_f8._M_cur =
               (__node_type *)
               pVar7.first.
               super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>.
               _M_cur;
          local_f0 = pVar7.second;
          ppVar3 = std::__detail::
                   _Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>
                               *)&local_f8);
          begin_local.Position = (PositionType)&ppVar3->second;
        }
      }
    }
    return (Def *)begin_local.Position;
  }
  __assert_fail("begin != end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDefinitions.cxx"
                ,0x11,
                "static const cmDefinitions::Def &cmDefinitions::GetInternal(const std::string &, StackIter, StackIter, bool)"
               );
}

Assistant:

cmDefinitions::Def const& cmDefinitions::GetInternal(const std::string& key,
                                                     StackIter begin,
                                                     StackIter end, bool raise)
{
  assert(begin != end);
  {
    auto it = begin->Map.find(cm::String::borrow(key));
    if (it != begin->Map.end()) {
      return it->second;
    }
  }
  StackIter it = begin;
  ++it;
  if (it == end) {
    return cmDefinitions::NoDef;
  }
  Def const& def = cmDefinitions::GetInternal(key, it, end, raise);
  if (!raise) {
    return def;
  }
  return begin->Map.emplace(key, def).first->second;
}